

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  size_t sVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  size_t sVar42;
  ulong uVar43;
  unsigned_long uVar44;
  ulong uVar45;
  vfloat4 v;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar75;
  float fVar76;
  vfloat4 v_2;
  float fVar77;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [12];
  float fVar78;
  float fVar79;
  float fVar90;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar86;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar104;
  float fVar109;
  float fVar110;
  vfloat4 v_1;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar116;
  undefined1 auVar117 [16];
  undefined4 uVar118;
  vfloat4 v_3;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [12];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar128;
  uint uVar131;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_198 [16];
  undefined1 auVar85 [16];
  undefined1 auVar124 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar43 = r->_begin;
  uVar44 = r->_end;
  aVar70 = _DAT_01f7a9f0;
  aVar116 = _DAT_01f7a9f0;
  auVar125 = _DAT_01f7aa00;
  auVar129 = _DAT_01f7aa00;
  if (uVar43 < uVar44) {
    sVar36 = 0;
    do {
      pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar43);
      uVar38 = (ulong)uVar4;
      uVar45 = (ulong)(uVar4 + 1);
      sVar42 = k;
      if (uVar45 < (pBVar5->super_RawBufferView).num) {
        pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        lVar39 = 0;
        do {
          lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar39);
          lVar37 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar39);
          lVar41 = lVar37 * uVar38;
          pfVar1 = (float *)(lVar7 + lVar41);
          auVar100._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar100._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar100._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar100._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
          auVar68._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar68._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar68._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar68._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
          iVar40 = movmskps((int)lVar41,auVar68 | auVar100);
          if (iVar40 != 0) goto LAB_009bc4af;
          lVar37 = lVar37 * uVar45;
          pfVar1 = (float *)(lVar7 + lVar37);
          auVar81._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar81._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar81._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar81._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
          auVar107._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar107._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar107._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar107._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
          iVar40 = movmskps((int)lVar37,auVar107 | auVar81);
          if (iVar40 != 0) goto LAB_009bc4af;
          lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar39);
          lVar37 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar39);
          lVar41 = lVar37 * uVar38;
          pfVar1 = (float *)(lVar7 + lVar41);
          auVar82._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar82._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar82._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar82._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
          auVar49._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar49._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar49._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar49._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
          iVar40 = movmskps((int)lVar41,auVar49 | auVar82);
          if (iVar40 != 0) goto LAB_009bc4af;
          pfVar1 = (float *)(lVar7 + lVar37 * uVar45);
          auVar83._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar83._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar83._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar83._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
          auVar50._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar50._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar50._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar50._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
          iVar40 = movmskps(0,auVar50 | auVar83);
          if (iVar40 != 0) goto LAB_009bc4af;
          lVar39 = lVar39 + 0x38;
        } while ((ulong)((this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar39);
        pcVar8 = (pBVar5->super_RawBufferView).ptr_ofs;
        sVar42 = (pBVar5->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar8 + sVar42 * uVar38);
        fVar133 = *pfVar1;
        fVar134 = pfVar1[1];
        fVar135 = pfVar1[2];
        auVar68 = *(undefined1 (*) [16])(pcVar8 + sVar42 * uVar45);
        fVar98 = auVar68._0_4_;
        fVar102 = auVar68._4_4_;
        fVar103 = auVar68._8_4_;
        pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar42 = (pBVar6->super_RawBufferView).stride;
        pfVar2 = (float *)(pcVar8 + uVar38 * sVar42);
        pfVar3 = (float *)(pcVar8 + sVar42 * uVar45);
        fVar111 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.maxRadiusScale;
        fVar96 = pfVar1[3] * fVar111;
        fVar97 = auVar68._12_4_ * fVar111;
        auVar46._0_12_ = auVar68._0_12_;
        auVar46._12_4_ = fVar97;
        fVar66 = *pfVar2 * 0.33333334 + fVar133;
        fVar75 = pfVar2[1] * 0.33333334 + fVar134;
        fVar76 = pfVar2[2] * 0.33333334 + fVar135;
        fVar77 = pfVar2[3] * fVar111 * 0.33333334 + fVar96;
        fVar104 = fVar98 - *pfVar3 * 0.33333334;
        fVar109 = fVar102 - pfVar3[1] * 0.33333334;
        fVar110 = fVar103 - pfVar3[2] * 0.33333334;
        fVar111 = fVar97 - pfVar3[3] * fVar111 * 0.33333334;
        uVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.tessellationRate;
        uVar38 = (ulong)uVar4;
        if (uVar38 == 4) {
          auVar122._0_4_ =
               fVar133 * (float)bezier_basis0._272_4_ +
               fVar66 * (float)bezier_basis0._1428_4_ +
               fVar104 * (float)bezier_basis0._2584_4_ + fVar98 * (float)bezier_basis0._3740_4_;
          auVar122._4_4_ =
               fVar133 * (float)bezier_basis0._276_4_ +
               fVar66 * (float)bezier_basis0._1432_4_ +
               fVar104 * (float)bezier_basis0._2588_4_ + fVar98 * (float)bezier_basis0._3744_4_;
          auVar122._8_4_ =
               fVar133 * (float)bezier_basis0._280_4_ +
               fVar66 * (float)bezier_basis0._1436_4_ +
               fVar104 * (float)bezier_basis0._2592_4_ + fVar98 * (float)bezier_basis0._3748_4_;
          auVar122._12_4_ =
               fVar133 * (float)bezier_basis0._284_4_ +
               fVar66 * (float)bezier_basis0._1440_4_ +
               fVar104 * (float)bezier_basis0._2596_4_ + fVar98 * (float)bezier_basis0._3752_4_;
          auVar112._0_4_ =
               fVar134 * (float)bezier_basis0._272_4_ +
               fVar75 * (float)bezier_basis0._1428_4_ +
               fVar109 * (float)bezier_basis0._2584_4_ + fVar102 * (float)bezier_basis0._3740_4_;
          auVar112._4_4_ =
               fVar134 * (float)bezier_basis0._276_4_ +
               fVar75 * (float)bezier_basis0._1432_4_ +
               fVar109 * (float)bezier_basis0._2588_4_ + fVar102 * (float)bezier_basis0._3744_4_;
          auVar112._8_4_ =
               fVar134 * (float)bezier_basis0._280_4_ +
               fVar75 * (float)bezier_basis0._1436_4_ +
               fVar109 * (float)bezier_basis0._2592_4_ + fVar102 * (float)bezier_basis0._3748_4_;
          auVar112._12_4_ =
               fVar134 * (float)bezier_basis0._284_4_ +
               fVar75 * (float)bezier_basis0._1440_4_ +
               fVar109 * (float)bezier_basis0._2596_4_ + fVar102 * (float)bezier_basis0._3752_4_;
          fVar133 = fVar135 * (float)bezier_basis0._272_4_ +
                    fVar76 * (float)bezier_basis0._1428_4_ +
                    fVar110 * (float)bezier_basis0._2584_4_ +
                    fVar103 * (float)bezier_basis0._3740_4_;
          fVar134 = fVar135 * (float)bezier_basis0._276_4_ +
                    fVar76 * (float)bezier_basis0._1432_4_ +
                    fVar110 * (float)bezier_basis0._2588_4_ +
                    fVar103 * (float)bezier_basis0._3744_4_;
          fVar66 = fVar135 * (float)bezier_basis0._280_4_ +
                   fVar76 * (float)bezier_basis0._1436_4_ +
                   fVar110 * (float)bezier_basis0._2592_4_ + fVar103 * (float)bezier_basis0._3748_4_
          ;
          fVar135 = fVar135 * (float)bezier_basis0._284_4_ +
                    fVar76 * (float)bezier_basis0._1440_4_ +
                    fVar110 * (float)bezier_basis0._2596_4_ +
                    fVar103 * (float)bezier_basis0._3752_4_;
          auVar51._0_8_ = CONCAT44(auVar122._0_4_,auVar122._4_4_);
          auVar51._8_4_ = auVar122._12_4_;
          auVar51._12_4_ = auVar122._8_4_;
          auVar67._8_4_ = auVar122._12_4_;
          auVar67._0_8_ = auVar51._0_8_;
          auVar67._12_4_ = auVar122._8_4_;
          auVar68 = minps(auVar67,auVar122);
          auVar99._0_8_ = auVar68._8_8_;
          auVar99._8_4_ = auVar68._0_4_;
          auVar99._12_4_ = auVar68._4_4_;
          auVar100 = minps(auVar99,auVar68);
          auVar69._0_8_ = CONCAT44(auVar112._0_4_,auVar112._4_4_);
          auVar69._8_4_ = auVar112._12_4_;
          auVar69._12_4_ = auVar112._8_4_;
          auVar105._8_4_ = auVar112._12_4_;
          auVar105._0_8_ = auVar69._0_8_;
          auVar105._12_4_ = auVar112._8_4_;
          auVar68 = minps(auVar105,auVar112);
          auVar84._0_8_ = auVar68._8_8_;
          auVar84._8_4_ = auVar68._0_4_;
          auVar84._12_4_ = auVar68._4_4_;
          auVar68 = minps(auVar84,auVar68);
          auVar101._0_8_ = CONCAT44(fVar133,fVar134);
          auVar101._8_4_ = fVar135;
          auVar101._12_4_ = fVar66;
          auVar106._8_4_ = fVar135;
          auVar106._0_8_ = auVar101._0_8_;
          auVar106._12_4_ = fVar66;
          auVar10._4_4_ = fVar134;
          auVar10._0_4_ = fVar133;
          auVar10._8_4_ = fVar66;
          auVar10._12_4_ = fVar135;
          auVar107 = minps(auVar106,auVar10);
          auVar115._0_8_ = auVar107._8_8_;
          auVar115._8_4_ = auVar107._0_4_;
          auVar115._12_4_ = auVar107._4_4_;
          auVar107 = minps(auVar115,auVar107);
          auVar80._4_4_ = auVar68._0_4_;
          auVar80._0_4_ = auVar100._0_4_;
          auVar80._8_4_ = auVar107._0_4_;
          auVar68 = maxps(auVar51,auVar122);
          auVar108._0_8_ = auVar68._8_8_;
          auVar108._8_4_ = auVar68._0_4_;
          auVar108._12_4_ = auVar68._4_4_;
          auVar100 = maxps(auVar108,auVar68);
          auVar68 = maxps(auVar69,auVar112);
          auVar123._0_8_ = auVar68._8_8_;
          auVar123._8_4_ = auVar68._0_4_;
          auVar123._12_4_ = auVar68._4_4_;
          auVar107 = maxps(auVar123,auVar68);
          auVar11._4_4_ = fVar134;
          auVar11._0_4_ = fVar133;
          auVar11._8_4_ = fVar66;
          auVar11._12_4_ = fVar135;
          auVar68 = maxps(auVar101,auVar11);
          auVar52._0_8_ = auVar68._8_8_;
          auVar52._8_4_ = auVar68._0_4_;
          auVar52._12_4_ = auVar68._4_4_;
          auVar68 = maxps(auVar52,auVar68);
          auVar121._4_4_ = auVar107._0_4_;
          auVar121._0_4_ = auVar100._0_4_;
          auVar121._8_4_ = auVar68._0_4_;
          local_198._8_4_ =
               ABS(fVar96 * (float)bezier_basis0._280_4_ +
                   fVar77 * (float)bezier_basis0._1436_4_ +
                   fVar111 * (float)bezier_basis0._2592_4_ + fVar97 * (float)bezier_basis0._3748_4_)
          ;
          local_198._0_8_ =
               CONCAT44(fVar96 * (float)bezier_basis0._276_4_ +
                        fVar77 * (float)bezier_basis0._1432_4_ +
                        fVar111 * (float)bezier_basis0._2588_4_ +
                        fVar97 * (float)bezier_basis0._3744_4_,
                        fVar96 * (float)bezier_basis0._272_4_ +
                        fVar77 * (float)bezier_basis0._1428_4_ +
                        fVar111 * (float)bezier_basis0._2584_4_ +
                        fVar97 * (float)bezier_basis0._3740_4_) & 0x7fffffff7fffffff;
          local_198._12_4_ =
               ABS(fVar96 * (float)bezier_basis0._284_4_ +
                   fVar77 * (float)bezier_basis0._1440_4_ +
                   fVar111 * (float)bezier_basis0._2596_4_ + fVar97 * (float)bezier_basis0._3752_4_)
          ;
        }
        else {
          if ((int)uVar4 < 1) {
            local_198 = ZEXT816(0);
            local_1b8 = _DAT_01f7aa00;
            local_1e8._8_8_ = 0x7f8000007f800000;
            local_1e8._0_8_ = 0x7f8000007f800000;
            local_1d8 = 0x7f800000;
            uStack_1d4 = 0x7f800000;
            uStack_1d0 = 0x7f800000;
            uStack_1cc = 0x7f800000;
            local_1c8 = 0x7f800000;
            uStack_1c4 = 0x7f800000;
            uStack_1c0 = 0x7f800000;
            uStack_1bc = 0x7f800000;
            auVar117 = _DAT_01f7aa00;
            auVar126 = _DAT_01f7aa00;
          }
          else {
            lVar39 = uVar38 * 0x44;
            local_198 = ZEXT816(0);
            uVar45 = 0;
            local_1c8 = 0x7f800000;
            uStack_1c4 = 0x7f800000;
            uStack_1c0 = 0x7f800000;
            uStack_1bc = 0x7f800000;
            local_1d8 = 0x7f800000;
            uStack_1d4 = 0x7f800000;
            uStack_1d0 = 0x7f800000;
            uStack_1cc = 0x7f800000;
            local_1e8._8_8_ = 0x7f8000007f800000;
            local_1e8._0_8_ = 0x7f8000007f800000;
            local_1b8 = _DAT_01f7aa00;
            auVar117 = _DAT_01f7aa00;
            auVar126 = _DAT_01f7aa00;
            do {
              uVar128 = (uint)uVar45;
              auVar113._0_4_ = -(uint)((int)uVar128 < (int)uVar4);
              auVar113._4_4_ = -(uint)((int)(uVar128 | 1) < (int)uVar4);
              auVar113._8_4_ = -(uint)((int)(uVar128 | 2) < (int)uVar4);
              auVar113._12_4_ = -(uint)((int)(uVar128 | 3) < (int)uVar4);
              pfVar1 = (float *)(lVar39 + 0x21aabec + uVar45 * 4);
              fVar12 = *pfVar1;
              fVar13 = pfVar1[1];
              fVar14 = pfVar1[2];
              fVar15 = pfVar1[3];
              pfVar1 = (float *)(lVar39 + 0x21ab070 + uVar45 * 4);
              fVar16 = *pfVar1;
              fVar17 = pfVar1[1];
              fVar18 = pfVar1[2];
              fVar19 = pfVar1[3];
              pfVar1 = (float *)(lVar39 + 0x21aa768 + uVar45 * 4);
              fVar20 = *pfVar1;
              fVar21 = pfVar1[1];
              fVar22 = pfVar1[2];
              fVar23 = pfVar1[3];
              pfVar1 = (float *)(bezier_basis0 + uVar45 * 4 + lVar39);
              fVar24 = *pfVar1;
              fVar25 = pfVar1[1];
              fVar26 = pfVar1[2];
              fVar27 = pfVar1[3];
              fVar78 = fVar133 * fVar24 + fVar66 * fVar20 + fVar104 * fVar12 + fVar98 * fVar16;
              fVar90 = fVar133 * fVar25 + fVar66 * fVar21 + fVar104 * fVar13 + fVar98 * fVar17;
              fVar92 = fVar133 * fVar26 + fVar66 * fVar22 + fVar104 * fVar14 + fVar98 * fVar18;
              fVar94 = fVar133 * fVar27 + fVar66 * fVar23 + fVar104 * fVar15 + fVar98 * fVar19;
              fVar79 = fVar134 * fVar24 + fVar75 * fVar20 + fVar109 * fVar12 + fVar102 * fVar16;
              fVar91 = fVar134 * fVar25 + fVar75 * fVar21 + fVar109 * fVar13 + fVar102 * fVar17;
              fVar93 = fVar134 * fVar26 + fVar75 * fVar22 + fVar109 * fVar14 + fVar102 * fVar18;
              fVar95 = fVar134 * fVar27 + fVar75 * fVar23 + fVar109 * fVar15 + fVar102 * fVar19;
              auVar87._0_4_ =
                   fVar135 * fVar24 + fVar76 * fVar20 + fVar110 * fVar12 + fVar103 * fVar16;
              auVar87._4_4_ =
                   fVar135 * fVar25 + fVar76 * fVar21 + fVar110 * fVar13 + fVar103 * fVar17;
              auVar87._8_4_ =
                   fVar135 * fVar26 + fVar76 * fVar22 + fVar110 * fVar14 + fVar103 * fVar18;
              auVar87._12_4_ =
                   fVar135 * fVar27 + fVar76 * fVar23 + fVar110 * fVar15 + fVar103 * fVar19;
              auVar34._4_4_ = fVar90;
              auVar34._0_4_ = fVar78;
              auVar34._8_4_ = fVar92;
              auVar34._12_4_ = fVar94;
              auVar68 = minps(local_1e8,auVar34);
              auVar130._0_4_ = auVar68._0_4_ & auVar113._0_4_;
              auVar130._4_4_ = auVar68._4_4_ & auVar113._4_4_;
              auVar130._8_4_ = auVar68._8_4_ & auVar113._8_4_;
              auVar130._12_4_ = auVar68._12_4_ & auVar113._12_4_;
              local_1e8 = auVar130 | ~auVar113 & local_1e8;
              auVar30._4_4_ = uStack_1d4;
              auVar30._0_4_ = local_1d8;
              auVar30._8_4_ = uStack_1d0;
              auVar30._12_4_ = uStack_1cc;
              auVar28._4_4_ = fVar91;
              auVar28._0_4_ = fVar79;
              auVar28._8_4_ = fVar93;
              auVar28._12_4_ = fVar95;
              auVar68 = minps(auVar30,auVar28);
              local_1d8 = auVar68._0_4_ & auVar113._0_4_ | ~auVar113._0_4_ & local_1d8;
              uStack_1d4 = auVar68._4_4_ & auVar113._4_4_ | ~auVar113._4_4_ & uStack_1d4;
              uStack_1d0 = auVar68._8_4_ & auVar113._8_4_ | ~auVar113._8_4_ & uStack_1d0;
              uStack_1cc = auVar68._12_4_ & auVar113._12_4_ | ~auVar113._12_4_ & uStack_1cc;
              auVar32._4_4_ = uStack_1c4;
              auVar32._0_4_ = local_1c8;
              auVar32._8_4_ = uStack_1c0;
              auVar32._12_4_ = uStack_1bc;
              auVar68 = minps(auVar32,auVar87);
              local_1c8 = auVar68._0_4_ & auVar113._0_4_ | ~auVar113._0_4_ & local_1c8;
              uStack_1c4 = auVar68._4_4_ & auVar113._4_4_ | ~auVar113._4_4_ & uStack_1c4;
              uStack_1c0 = auVar68._8_4_ & auVar113._8_4_ | ~auVar113._8_4_ & uStack_1c0;
              uStack_1bc = auVar68._12_4_ & auVar113._12_4_ | ~auVar113._12_4_ & uStack_1bc;
              uVar128 = local_1b8._0_4_;
              uVar131 = local_1b8._8_4_;
              uVar132 = local_1b8._12_4_;
              auVar35._4_4_ = fVar90;
              auVar35._0_4_ = fVar78;
              auVar35._8_4_ = fVar92;
              auVar35._12_4_ = fVar94;
              auVar68 = maxps(local_1b8,auVar35);
              local_1b8._4_4_ = auVar68._4_4_ & auVar113._4_4_ | ~auVar113._4_4_ & local_1b8._4_4_;
              local_1b8._0_4_ = auVar68._0_4_ & auVar113._0_4_ | ~auVar113._0_4_ & uVar128;
              local_1b8._8_4_ = auVar68._8_4_ & auVar113._8_4_ | ~auVar113._8_4_ & uVar131;
              local_1b8._12_4_ = auVar68._12_4_ & auVar113._12_4_ | ~auVar113._12_4_ & uVar132;
              auVar57._0_4_ = ~auVar113._0_4_ & auVar126._0_4_;
              auVar57._4_4_ = ~auVar113._4_4_ & auVar126._4_4_;
              auVar57._8_4_ = ~auVar113._8_4_ & auVar126._8_4_;
              auVar57._12_4_ = ~auVar113._12_4_ & auVar126._12_4_;
              auVar29._4_4_ = fVar91;
              auVar29._0_4_ = fVar79;
              auVar29._8_4_ = fVar93;
              auVar29._12_4_ = fVar95;
              auVar68 = maxps(auVar126,auVar29);
              auVar126._0_4_ = auVar68._0_4_ & auVar113._0_4_;
              auVar126._4_4_ = auVar68._4_4_ & auVar113._4_4_;
              auVar126._8_4_ = auVar68._8_4_ & auVar113._8_4_;
              auVar126._12_4_ = auVar68._12_4_ & auVar113._12_4_;
              auVar126 = auVar126 | auVar57;
              auVar58._0_4_ = ~auVar113._0_4_ & auVar117._0_4_;
              auVar58._4_4_ = ~auVar113._4_4_ & auVar117._4_4_;
              auVar58._8_4_ = ~auVar113._8_4_ & auVar117._8_4_;
              auVar58._12_4_ = ~auVar113._12_4_ & auVar117._12_4_;
              auVar68 = maxps(auVar117,auVar87);
              auVar117._0_4_ = auVar68._0_4_ & auVar113._0_4_;
              auVar117._4_4_ = auVar68._4_4_ & auVar113._4_4_;
              auVar117._8_4_ = auVar68._8_4_ & auVar113._8_4_;
              auVar117._12_4_ = auVar68._12_4_ & auVar113._12_4_;
              auVar117 = auVar117 | auVar58;
              auVar88._0_8_ =
                   CONCAT44(fVar25 * fVar96 + fVar21 * fVar77 + fVar13 * fVar111 + fVar17 * fVar97,
                            fVar24 * fVar96 + fVar20 * fVar77 + fVar12 * fVar111 + fVar16 * fVar97)
                   & 0x7fffffff7fffffff;
              auVar88._8_4_ =
                   ABS(fVar26 * fVar96 + fVar22 * fVar77 + fVar14 * fVar111 + fVar18 * fVar97);
              auVar88._12_4_ =
                   ABS(fVar27 * fVar96 + fVar23 * fVar77 + fVar15 * fVar111 + fVar19 * fVar97);
              auVar68 = maxps(local_198,auVar88);
              auVar59._0_4_ = auVar68._0_4_ & auVar113._0_4_;
              auVar59._4_4_ = auVar68._4_4_ & auVar113._4_4_;
              auVar59._8_4_ = auVar68._8_4_ & auVar113._8_4_;
              auVar59._12_4_ = auVar68._12_4_ & auVar113._12_4_;
              auVar114._0_4_ = ~auVar113._0_4_ & local_198._0_4_;
              auVar114._4_4_ = ~auVar113._4_4_ & local_198._4_4_;
              auVar114._8_4_ = ~auVar113._8_4_ & local_198._8_4_;
              auVar114._12_4_ = ~auVar113._12_4_ & local_198._12_4_;
              local_198 = auVar114 | auVar59;
              uVar45 = uVar45 + 4;
            } while (uVar45 < uVar38);
          }
          auVar60._4_4_ = local_1e8._0_4_;
          auVar60._0_4_ = local_1e8._4_4_;
          auVar60._8_4_ = local_1e8._12_4_;
          auVar60._12_4_ = local_1e8._8_4_;
          auVar68 = minps(auVar60,local_1e8);
          auVar71._0_8_ = auVar68._8_8_;
          auVar71._8_4_ = auVar68._0_4_;
          auVar71._12_4_ = auVar68._4_4_;
          auVar100 = minps(auVar71,auVar68);
          auVar31._4_4_ = uStack_1d4;
          auVar31._0_4_ = local_1d8;
          auVar31._8_4_ = uStack_1d0;
          auVar31._12_4_ = uStack_1cc;
          auVar61._4_4_ = local_1d8;
          auVar61._0_4_ = uStack_1d4;
          auVar61._8_4_ = uStack_1cc;
          auVar61._12_4_ = uStack_1d0;
          auVar68 = minps(auVar61,auVar31);
          auVar89._0_8_ = auVar68._8_8_;
          auVar89._8_4_ = auVar68._0_4_;
          auVar89._12_4_ = auVar68._4_4_;
          auVar107 = minps(auVar89,auVar68);
          auVar33._4_4_ = uStack_1c4;
          auVar33._0_4_ = local_1c8;
          auVar33._8_4_ = uStack_1c0;
          auVar33._12_4_ = uStack_1bc;
          auVar62._4_4_ = local_1c8;
          auVar62._0_4_ = uStack_1c4;
          auVar62._8_4_ = uStack_1bc;
          auVar62._12_4_ = uStack_1c0;
          auVar68 = minps(auVar62,auVar33);
          auVar72._0_8_ = auVar68._8_8_;
          auVar72._8_4_ = auVar68._0_4_;
          auVar72._12_4_ = auVar68._4_4_;
          auVar68 = minps(auVar72,auVar68);
          auVar80._4_4_ = auVar107._0_4_;
          auVar80._0_4_ = auVar100._0_4_;
          auVar80._8_4_ = auVar68._0_4_;
          auVar63._4_4_ = local_1b8._0_4_;
          auVar63._0_4_ = local_1b8._4_4_;
          auVar63._8_4_ = local_1b8._12_4_;
          auVar63._12_4_ = local_1b8._8_4_;
          auVar68 = maxps(auVar63,local_1b8);
          auVar73._0_8_ = auVar68._8_8_;
          auVar73._8_4_ = auVar68._0_4_;
          auVar73._12_4_ = auVar68._4_4_;
          auVar100 = maxps(auVar73,auVar68);
          auVar64._4_4_ = auVar126._0_4_;
          auVar64._0_4_ = auVar126._4_4_;
          auVar64._8_4_ = auVar126._12_4_;
          auVar64._12_4_ = auVar126._8_4_;
          auVar68 = maxps(auVar64,auVar126);
          auVar127._0_8_ = auVar68._8_8_;
          auVar127._8_4_ = auVar68._0_4_;
          auVar127._12_4_ = auVar68._4_4_;
          auVar107 = maxps(auVar127,auVar68);
          auVar65._4_4_ = auVar117._0_4_;
          auVar65._0_4_ = auVar117._4_4_;
          auVar65._8_4_ = auVar117._12_4_;
          auVar65._12_4_ = auVar117._8_4_;
          auVar68 = maxps(auVar65,auVar117);
          auVar74._0_8_ = auVar68._8_8_;
          auVar74._8_4_ = auVar68._0_4_;
          auVar74._12_4_ = auVar68._4_4_;
          auVar68 = maxps(auVar74,auVar68);
          auVar121._4_4_ = auVar107._0_4_;
          auVar121._0_4_ = auVar100._0_4_;
          auVar121._8_4_ = auVar68._0_4_;
        }
        auVar124._12_4_ = 0;
        auVar124._0_12_ = auVar121;
        auVar85._12_4_ = 0;
        auVar85._0_12_ = auVar80;
        auVar119._4_4_ = local_198._0_4_;
        auVar119._0_4_ = local_198._4_4_;
        auVar119._8_4_ = local_198._12_4_;
        auVar119._12_4_ = local_198._8_4_;
        auVar68 = maxps(auVar119,local_198);
        uVar118 = auVar68._0_4_;
        auVar120._8_4_ = auVar68._8_4_;
        auVar53._4_4_ = uVar118;
        auVar53._0_4_ = uVar118;
        auVar53._8_4_ = uVar118;
        auVar53._12_4_ = uVar118;
        auVar120._4_4_ = auVar120._8_4_;
        auVar120._0_4_ = auVar120._8_4_;
        auVar120._12_4_ = auVar120._8_4_;
        auVar100 = maxps(auVar120,auVar53);
        auVar68 = minps(auVar85,auVar46);
        auVar107 = maxps(auVar124,auVar46);
        auVar9._8_4_ = ABS(fVar97);
        auVar9._0_8_ = CONCAT44(fVar97,fVar97) & 0x7fffffff7fffffff;
        auVar9._12_4_ = ABS(fVar97);
        auVar100 = maxps(auVar100,auVar9);
        fVar133 = auVar68._0_4_ - auVar100._0_4_;
        fVar134 = auVar68._4_4_ - auVar100._4_4_;
        fVar135 = auVar68._8_4_ - auVar100._8_4_;
        fVar66 = auVar100._0_4_ + auVar107._0_4_;
        fVar75 = auVar100._4_4_ + auVar107._4_4_;
        fVar76 = auVar100._8_4_ + auVar107._8_4_;
        auVar54._0_8_ = CONCAT44(fVar134,fVar133) & 0x7fffffff7fffffff;
        auVar54._8_4_ = ABS(fVar135);
        auVar54._12_4_ = ABS(auVar68._12_4_ - auVar100._12_4_);
        auVar47._0_8_ = CONCAT44(fVar75,fVar66) & 0x7fffffff7fffffff;
        auVar47._8_4_ = ABS(fVar76);
        auVar47._12_4_ = ABS(auVar100._12_4_ + auVar107._12_4_);
        auVar68 = maxps(auVar54,auVar47);
        fVar111 = auVar68._4_4_;
        if (auVar68._4_4_ <= auVar68._0_4_) {
          fVar111 = auVar68._0_4_;
        }
        auVar55._8_8_ = auVar68._8_8_;
        auVar55._0_8_ = auVar68._8_8_;
        if (auVar68._8_4_ <= fVar111) {
          auVar55._0_4_ = fVar111;
        }
        fVar111 = auVar55._0_4_ * 4.7683716e-07;
        aVar86._0_4_ = fVar133 - fVar111;
        aVar86._4_4_ = fVar134 - fVar111;
        aVar86._8_4_ = fVar135 - fVar111;
        aVar56._0_4_ = fVar111 + fVar66;
        aVar56._4_4_ = fVar111 + fVar75;
        aVar56._8_4_ = fVar111 + fVar76;
        aVar86.m128[3] = (float)geomID;
        aVar56.m128[3] = (float)uVar43;
        aVar70.m128 = (__m128)minps(aVar70.m128,aVar86.m128);
        auVar129 = maxps(auVar129,(undefined1  [16])aVar56);
        auVar48._0_4_ = aVar86._0_4_ + aVar56._0_4_;
        auVar48._4_4_ = aVar86._4_4_ + aVar56._4_4_;
        auVar48._8_4_ = aVar86._8_4_ + aVar56._8_4_;
        auVar48._12_4_ = (float)geomID + (float)uVar43;
        aVar116.m128 = (__m128)minps(aVar116.m128,auVar48);
        auVar125 = maxps(auVar125,auVar48);
        sVar36 = sVar36 + 1;
        sVar42 = k + 1;
        prims[k].lower.field_0 = aVar86;
        prims[k].upper.field_0 = aVar56;
        uVar44 = r->_end;
      }
LAB_009bc4af:
      uVar43 = uVar43 + 1;
      k = sVar42;
    } while (uVar43 < uVar44);
  }
  else {
    sVar36 = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar70;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar129;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar116;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar125;
  __return_storage_ptr__->end = sVar36;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }